

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall Json::OurReader::skipCommentTokens(OurReader *this,Token *token)

{
  int *in_RSI;
  Token *in_RDI;
  OurReader *unaff_retaddr;
  
  if ((in_RDI[0xb].field_0x4 & 1) == 0) {
    readToken(unaff_retaddr,in_RDI);
  }
  else {
    do {
      readToken(unaff_retaddr,in_RDI);
    } while (*in_RSI == 0xc);
  }
  return;
}

Assistant:

void OurReader::skipCommentTokens(Token& token) {
  if (features_.allowComments_) {
    do {
      readToken(token);
    } while (token.type_ == tokenComment);
  } else {
    readToken(token);
  }
}